

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_8edda9::Helper::MakeFilesFullPath
          (Helper *this,char *modeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  pointer pbVar1;
  bool bVar2;
  size_type sVar3;
  pointer args;
  string file;
  char local_89;
  Helper *local_88;
  string *local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  local_88 = this;
  local_80 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
  args = (relFiles->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_78 = modeName;
  do {
    if (args == pbVar1) {
LAB_002a2e74:
      return args == pbVar1;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)args);
    sVar3 = cmGeneratorExpression::Find(&local_50);
    if (sVar3 != 0) {
      bVar2 = cmsys::SystemTools::FileIsFullPath(&local_50);
      if (!bVar2) {
        local_89 = '/';
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                  (&local_70,local_80,&local_89,args);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      if (sVar3 == 0xffffffffffffffff) {
        bVar2 = cmsys::SystemTools::FileIsSymlink(&local_50);
        if (!bVar2) {
          bVar2 = cmsys::SystemTools::FileIsDirectory(&local_50);
          if (bVar2) {
            cmStrCat<char_const*&,char_const(&)[19],std::__cxx11::string_const&,char_const(&)[14]>
                      (&local_70,&local_78,(char (*) [19])" given directory \"",args,
                       (char (*) [14])"\" to install.");
            SetError(local_88,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_50);
            goto LAB_002a2e74;
          }
        }
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)absFiles,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    args = args + 1;
  } while( true );
}

Assistant:

bool Helper::MakeFilesFullPath(const char* modeName,
                               const std::vector<std::string>& relFiles,
                               std::vector<std::string>& absFiles)
{
  return this->MakeFilesFullPath(
    modeName, this->Makefile->GetCurrentSourceDirectory(), relFiles, absFiles);
}